

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void SerializeHDKeypath<DataStream>(DataStream *s,KeyOriginInfo *hd_keypath)

{
  long lVar1;
  KeyOriginInfo *in_RSI;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  KeyOriginInfo *in_stack_ffffffffffffff88;
  DataStream *os;
  KeyOriginInfo *hd_keypath_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  os = in_RDI;
  hd_keypath_00 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff88);
  WriteCompactSize<DataStream>(os,(uint64_t)in_RSI);
  KeyOriginInfo::KeyOriginInfo(in_stack_ffffffffffffff88,(KeyOriginInfo *)0x5a2bf5);
  SerializeKeyOrigin<DataStream>(in_RDI,hd_keypath_00);
  KeyOriginInfo::~KeyOriginInfo(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeHDKeypath(Stream& s, KeyOriginInfo hd_keypath)
{
    WriteCompactSize(s, (hd_keypath.path.size() + 1) * sizeof(uint32_t));
    SerializeKeyOrigin(s, hd_keypath);
}